

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.hpp
# Opt level: O0

int timings<std::complex<double>,main::__1>
              (int qmin,int qmax,int qstep,int test,anon_class_1_0_00000001 *lambda,int IMAX_CPU,
              int IMAX_GPU)

{
  pointer *this;
  value_type vVar1;
  value_type vVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  size_type sVar6;
  uint *puVar7;
  reference pvVar8;
  int local_a4;
  int i;
  int local_8c;
  int r;
  int q;
  vector<double,_std::allocator<double>_> T_gpu;
  vector<double,_std::allocator<double>_> T_cpu;
  vector<int,_std::allocator<int>_> qubits;
  double t_gpu;
  double t_cpu;
  anon_class_1_0_00000001 *paStack_28;
  int IMAX_CPU_local;
  anon_class_1_0_00000001 *lambda_local;
  int local_18;
  int test_local;
  int qstep_local;
  int qmax_local;
  int qmin_local;
  
  t_cpu._4_4_ = IMAX_CPU;
  paStack_28 = lambda;
  lambda_local._4_4_ = test;
  local_18 = qstep;
  test_local = qmax;
  qstep_local = qmin;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&r);
  for (local_8c = qstep_local; local_8c <= test_local; local_8c = local_18 + local_8c) {
    iVar5 = run<std::complex<double>,main::__1>
                      (local_8c,lambda_local._4_4_,&t_gpu,
                       (double *)
                       &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,paStack_28,t_cpu._4_4_,IMAX_GPU);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_8c);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&t_gpu);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&r,
               (value_type_conflict2 *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    qmax_local = iVar5;
    if (iVar5 != 0) goto LAB_00108173;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  for (local_a4 = 0;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), (ulong)(long)local_a4 < sVar6;
      local_a4 = local_a4 + 1) {
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)local_a4);
    uVar4 = *puVar7;
    this = &T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this,(long)local_a4);
    vVar1 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&r,(long)local_a4);
    vVar2 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this,(long)local_a4);
    dVar3 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&r,(long)local_a4);
    printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",vVar1,vVar2,dVar3 / *pvVar8,(ulong)uVar4);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  qmax_local = 0;
LAB_00108173:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&r);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return qmax_local;
}

Assistant:

int timings( const int qmin , const int qmax , const int qstep , const int test,
             F& lambda , const int IMAX_CPU = 3 , const int IMAX_GPU = 3 ) {

  // omp
#ifdef _OPENMP
  std::cout << "  --> omp_max_threads() = " << omp_get_max_threads() << "\n" ;
#endif

  // variables
  double t_cpu ;
  double t_gpu ;
  std::vector< int > qubits ;
  std::vector< double > T_cpu ;
  std::vector< double > T_gpu ;

  // run
  for ( int q = qmin; q <= qmax; q += qstep ) {
    int r = run< T , F >( q , test , t_cpu , t_gpu ,
                          lambda , IMAX_CPU , IMAX_GPU ) ;
    qubits.push_back( q ) ;
    T_cpu.push_back( t_cpu ) ;
    T_gpu.push_back( t_gpu ) ;
    if ( r != 0 ) return r ;
  }

  // output
  std::cout << std::endl ;
  for ( int i = 0; i < qubits.size(); ++i ) {
    std::printf( "  %2i | %12.6fs | %12.6fs | %6.2fx\n" ,
                 qubits[i] , T_cpu[i] , T_gpu[i] , T_cpu[i] / T_gpu[i] ) ;
  }
  std::cout << std::endl ;

  // successful
  return 0 ;

}